

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O0

Guard * createGuard(GuardType type)

{
  Guard *pGVar1;
  Guard *guard;
  GuardType type_local;
  
  pGVar1 = (Guard *)malloc(0x18);
  guard._4_1_ = (char)type;
  pGVar1->type = guard._4_1_;
  pGVar1->position = -1;
  switch(type) {
  case CYBORG:
    pGVar1->damage = 0xc;
    pGVar1->range = 8;
    pGVar1->cooldown = 2;
    pGVar1->ai = PROX;
    break;
  case DOGS:
    pGVar1->damage = 4;
    pGVar1->range = 4;
    pGVar1->cooldown = 6;
    pGVar1->ai = AOE;
    break;
  default:
    quit("Creating unsupported unit type.");
    break;
  case GUARD:
    pGVar1->damage = 5;
    pGVar1->range = 2;
    pGVar1->cooldown = 4;
    pGVar1->ai = PROX;
    break;
  case LUNCH:
    pGVar1->damage = 0;
    pGVar1->range = 6;
    pGVar1->cooldown = 0xc;
    pGVar1->ai = AOE;
    break;
  case PSYCH:
    pGVar1->damage = 0;
    pGVar1->range = 6;
    pGVar1->cooldown = 0xc;
    pGVar1->ai = PROX;
    break;
  case SHARP:
    pGVar1->damage = 6;
    pGVar1->range = 10;
    pGVar1->cooldown = 8;
    pGVar1->ai = END;
    break;
  case WARDEN:
    pGVar1->damage = 100;
    pGVar1->range = 8;
    pGVar1->cooldown = 2;
    pGVar1->ai = PROX;
  }
  return pGVar1;
}

Assistant:

struct Guard *createGuard(enum GuardType type) {

    struct Guard *guard = malloc(sizeof(struct Guard));

    guard->type = type;
    guard->position = -1;

    switch (type) {

        case GUARD:
            guard->damage = 5;
            guard->range = 2;
            guard->cooldown = 4;
            guard->ai = PROX;
            break;

        case DOGS:
            guard->damage = 4;
            guard->range = 4;
            guard->cooldown = 6;
            guard->ai = AOE;
            break;

        case LUNCH:
            guard->damage = 0;
            guard->range = 6;
            guard->cooldown = 12;
            guard->ai = AOE;
            break;

        case PSYCH:
            guard->damage = 0;
            guard->range = 6;
            guard->cooldown = 12;
            guard->ai = PROX;
            break;

        case SHARP:
            guard->damage = 6;
            guard->range = 10;
            guard->cooldown = 8;
            guard->ai = END;
            break;

        case WARDEN:
            guard->damage = 100;
            guard->range = 8;
            guard->cooldown = 2;
            guard->ai = PROX;
            break;

        case CYBORG:
            guard->damage = 12;
            guard->range = 8;
            guard->cooldown = 2;
            guard->ai = PROX;
            break;

        default:
            quit("Creating unsupported unit type.");
            break;
    }

    return guard;
}